

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_coin.cpp
# Opt level: O0

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * CfdGetElementsUtxoListByC(bool use_asset)

{
  uchar *puVar1;
  byte in_SIL;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_RDI;
  Utxo utxo_11;
  Txid txid_11;
  Utxo utxo_10;
  Txid txid_10;
  Utxo utxo_9;
  Txid txid_9;
  Utxo utxo_8;
  Txid txid_8;
  Utxo utxo_7;
  Txid txid_7;
  Utxo utxo_6;
  Txid txid_6;
  Utxo utxo_5;
  Txid txid_5;
  Utxo utxo_4;
  Txid txid_4;
  Utxo utxo_3;
  Txid txid_3;
  Utxo utxo_2;
  Txid txid_2;
  Utxo utxo_1;
  Txid txid_1;
  Utxo utxo;
  Txid txid;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *utxos;
  value_type *in_stack_ffffffffffffeb98;
  value_type *__x;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_ffffffffffffeba0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *this;
  ByteData local_1228;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1210;
  ByteData local_11f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_11e0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  ulong uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  allocator local_10e9;
  string local_10e8;
  Txid local_10c8;
  ByteData local_10a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1090;
  ByteData local_1078;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1060;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  ulong uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  allocator local_f69;
  string local_f68;
  Txid local_f48;
  ByteData local_f28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f10;
  ByteData local_ef8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_ee0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  ulong uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  allocator local_de9;
  string local_de8;
  Txid local_dc8;
  ByteData local_da8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d90;
  ByteData local_d78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d60;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  ulong uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  allocator local_c69;
  string local_c68;
  Txid local_c48;
  ByteData local_c28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c10;
  ByteData local_bf8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_be0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  ulong uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  allocator local_ae9;
  string local_ae8;
  Txid local_ac8;
  ByteData local_aa8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a90;
  ByteData local_a78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a60;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  ulong uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  allocator local_969;
  string local_968;
  Txid local_948;
  ByteData local_928;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_910;
  ByteData local_8f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_8e0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  ulong uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  allocator local_7e9;
  string local_7e8;
  Txid local_7c8;
  ByteData local_7a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_790;
  ByteData local_778;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_760;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  ulong uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  allocator local_669;
  string local_668;
  Txid local_648;
  ByteData local_628;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_610;
  ByteData local_5f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5e0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  ulong uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  allocator local_4e9;
  string local_4e8;
  Txid local_4c8;
  ByteData local_4a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_490;
  ByteData local_478;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_460;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  ulong uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  allocator local_369;
  string local_368;
  Txid local_348;
  ByteData local_328;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_310;
  ByteData local_2f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2e0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  ulong uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  allocator local_1e9;
  string local_1e8;
  Txid local_1c8;
  ByteData local_1a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_190;
  ByteData local_178;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_160;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  ulong uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  allocator local_51;
  string local_50;
  Txid local_30;
  undefined1 local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = 0;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x30c25b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a",
             &local_51);
  cfd::core::Txid::Txid(&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_78 = 0;
  cfd::core::Txid::GetData(&local_178,&local_30);
  cfd::core::ByteData::GetBytes(&local_160,&local_178);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30c389);
  uStack_120 = *(undefined8 *)puVar1;
  local_118 = *(undefined8 *)(puVar1 + 8);
  uStack_110 = *(undefined8 *)(puVar1 + 0x10);
  local_108 = *(undefined8 *)(puVar1 + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
  cfd::core::ByteData::~ByteData((ByteData *)0x30c3cc);
  uStack_100 = uStack_100 & 0xffffffff00000000;
  local_c8 = 0x12a05f20;
  if ((local_9 & 1) != 0) {
    cfd::core::ConfidentialAssetId::GetData(&local_1a8,&exp_dummy_asset_ca);
    cfd::core::ByteData::GetBytes(&local_190,&local_1a8);
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30c43b);
    memcpy((void *)((long)&uStack_c0 + 1),puVar1,0x21);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
    cfd::core::ByteData::~ByteData((ByteData *)0x30c46a);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
            (in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
  cfd::core::Txid::~Txid((Txid *)0x30c541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1e8,"30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a"
             ,&local_1e9);
  cfd::core::Txid::Txid(&local_1c8,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  local_208 = 0;
  uStack_200 = 0;
  local_218 = 0;
  uStack_210 = 0;
  local_228 = 0;
  uStack_220 = 0;
  local_238 = 0;
  uStack_230 = 0;
  local_248 = 0;
  uStack_240 = 0;
  local_258 = 0;
  uStack_250 = 0;
  local_268 = 0;
  uStack_260 = 0;
  local_278 = 0;
  uStack_270 = 0;
  local_288 = 0;
  uStack_280 = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_1f8 = 0;
  cfd::core::Txid::GetData(&local_2f8,&local_1c8);
  cfd::core::ByteData::GetBytes(&local_2e0,&local_2f8);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30c66f);
  uStack_2a0 = *(undefined8 *)puVar1;
  local_298 = *(undefined8 *)(puVar1 + 8);
  uStack_290 = *(undefined8 *)(puVar1 + 0x10);
  local_288 = *(undefined8 *)(puVar1 + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
  cfd::core::ByteData::~ByteData((ByteData *)0x30c6b2);
  uStack_280 = uStack_280 & 0xffffffff00000000;
  local_248 = 0x4a817c8;
  if ((local_9 & 1) != 0) {
    cfd::core::ConfidentialAssetId::GetData(&local_328,&exp_dummy_asset_ca);
    cfd::core::ByteData::GetBytes(&local_310,&local_328);
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30c721);
    memcpy((void *)((long)&uStack_240 + 1),puVar1,0x21);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
    cfd::core::ByteData::~ByteData((ByteData *)0x30c750);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
            (in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
  cfd::core::Txid::~Txid((Txid *)0x30c839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_368,"9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a"
             ,&local_369);
  cfd::core::Txid::Txid(&local_348,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  local_388 = 0;
  uStack_380 = 0;
  local_398 = 0;
  uStack_390 = 0;
  local_3a8 = 0;
  uStack_3a0 = 0;
  local_3b8 = 0;
  uStack_3b0 = 0;
  local_3c8 = 0;
  uStack_3c0 = 0;
  local_3d8 = 0;
  uStack_3d0 = 0;
  local_3e8 = 0;
  uStack_3e0 = 0;
  local_3f8 = 0;
  uStack_3f0 = 0;
  local_408 = 0;
  uStack_400 = 0;
  local_418 = 0;
  uStack_410 = 0;
  local_428 = 0;
  uStack_420 = 0;
  local_438 = 0;
  uStack_430 = 0;
  local_448 = 0;
  uStack_440 = 0;
  local_378 = 0;
  cfd::core::Txid::GetData(&local_478,&local_348);
  cfd::core::ByteData::GetBytes(&local_460,&local_478);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30c967);
  uStack_420 = *(undefined8 *)puVar1;
  local_418 = *(undefined8 *)(puVar1 + 8);
  uStack_410 = *(undefined8 *)(puVar1 + 0x10);
  local_408 = *(undefined8 *)(puVar1 + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
  cfd::core::ByteData::~ByteData((ByteData *)0x30c9aa);
  uStack_400 = uStack_400 & 0xffffffff00000000;
  local_3c8 = 1250000000;
  if ((local_9 & 1) != 0) {
    cfd::core::ConfidentialAssetId::GetData(&local_4a8,&exp_dummy_asset_ca);
    cfd::core::ByteData::GetBytes(&local_490,&local_4a8);
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30ca19);
    memcpy((void *)((long)&uStack_3c0 + 1),puVar1,0x21);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
    cfd::core::ByteData::~ByteData((ByteData *)0x30ca48);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
            (in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
  cfd::core::Txid::~Txid((Txid *)0x30cb31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4e8,"8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a"
             ,&local_4e9);
  cfd::core::Txid::Txid(&local_4c8,&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  local_508 = 0;
  uStack_500 = 0;
  local_518 = 0;
  uStack_510 = 0;
  local_528 = 0;
  uStack_520 = 0;
  local_538 = 0;
  uStack_530 = 0;
  local_548 = 0;
  uStack_540 = 0;
  local_558 = 0;
  uStack_550 = 0;
  local_568 = 0;
  uStack_560 = 0;
  local_578 = 0;
  uStack_570 = 0;
  local_588 = 0;
  uStack_580 = 0;
  local_598 = 0;
  uStack_590 = 0;
  local_5a8 = 0;
  uStack_5a0 = 0;
  local_5b8 = 0;
  uStack_5b0 = 0;
  local_5c8 = 0;
  uStack_5c0 = 0;
  local_4f8 = 0;
  cfd::core::Txid::GetData(&local_5f8,&local_4c8);
  cfd::core::ByteData::GetBytes(&local_5e0,&local_5f8);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30cc5f);
  uStack_5a0 = *(undefined8 *)puVar1;
  local_598 = *(undefined8 *)(puVar1 + 8);
  uStack_590 = *(undefined8 *)(puVar1 + 0x10);
  local_588 = *(undefined8 *)(puVar1 + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
  cfd::core::ByteData::~ByteData((ByteData *)0x30cca2);
  uStack_580 = uStack_580 & 0xffffffff00000000;
  local_548 = 0x2540be4;
  if ((local_9 & 1) != 0) {
    cfd::core::ConfidentialAssetId::GetData(&local_628,&exp_dummy_asset_ca);
    cfd::core::ByteData::GetBytes(&local_610,&local_628);
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30cd11);
    memcpy((void *)((long)&uStack_540 + 1),puVar1,0x21);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
    cfd::core::ByteData::~ByteData((ByteData *)0x30cd40);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
            (in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
  cfd::core::Txid::~Txid((Txid *)0x30ce29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_668,"4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a"
             ,&local_669);
  cfd::core::Txid::Txid(&local_648,&local_668);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator((allocator<char> *)&local_669);
  local_688 = 0;
  uStack_680 = 0;
  local_698 = 0;
  uStack_690 = 0;
  local_6a8 = 0;
  uStack_6a0 = 0;
  local_6b8 = 0;
  uStack_6b0 = 0;
  local_6c8 = 0;
  uStack_6c0 = 0;
  local_6d8 = 0;
  uStack_6d0 = 0;
  local_6e8 = 0;
  uStack_6e0 = 0;
  local_6f8 = 0;
  uStack_6f0 = 0;
  local_708 = 0;
  uStack_700 = 0;
  local_718 = 0;
  uStack_710 = 0;
  local_728 = 0;
  uStack_720 = 0;
  local_738 = 0;
  uStack_730 = 0;
  local_748 = 0;
  uStack_740 = 0;
  local_678 = 0;
  cfd::core::Txid::GetData(&local_778,&local_648);
  cfd::core::ByteData::GetBytes(&local_760,&local_778);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30cf57);
  uStack_720 = *(undefined8 *)puVar1;
  local_718 = *(undefined8 *)(puVar1 + 8);
  uStack_710 = *(undefined8 *)(puVar1 + 0x10);
  local_708 = *(undefined8 *)(puVar1 + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
  cfd::core::ByteData::~ByteData((ByteData *)0x30cf9a);
  uStack_700 = uStack_700 & 0xffffffff00000000;
  local_6c8 = 0x9502f90;
  if ((local_9 & 1) != 0) {
    cfd::core::ConfidentialAssetId::GetData(&local_7a8,&exp_dummy_asset_ca);
    cfd::core::ByteData::GetBytes(&local_790,&local_7a8);
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30d009);
    memcpy((void *)((long)&uStack_6c0 + 1),puVar1,0x21);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
    cfd::core::ByteData::~ByteData((ByteData *)0x30d038);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
            (in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
  cfd::core::Txid::~Txid((Txid *)0x30d121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7e8,"b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b"
             ,&local_7e9);
  cfd::core::Txid::Txid(&local_7c8,&local_7e8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  local_808 = 0;
  uStack_800 = 0;
  local_818 = 0;
  uStack_810 = 0;
  local_828 = 0;
  uStack_820 = 0;
  local_838 = 0;
  uStack_830 = 0;
  local_848 = 0;
  uStack_840 = 0;
  local_858 = 0;
  uStack_850 = 0;
  local_868 = 0;
  uStack_860 = 0;
  local_878 = 0;
  uStack_870 = 0;
  local_888 = 0;
  uStack_880 = 0;
  local_898 = 0;
  uStack_890 = 0;
  local_8a8 = 0;
  uStack_8a0 = 0;
  local_8b8 = 0;
  uStack_8b0 = 0;
  local_8c8 = 0;
  uStack_8c0 = 0;
  local_7f8 = 0;
  cfd::core::Txid::GetData(&local_8f8,&local_7c8);
  cfd::core::ByteData::GetBytes(&local_8e0,&local_8f8);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30d24f);
  uStack_8a0 = *(undefined8 *)puVar1;
  local_898 = *(undefined8 *)(puVar1 + 8);
  uStack_890 = *(undefined8 *)(puVar1 + 0x10);
  local_888 = *(undefined8 *)(puVar1 + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
  cfd::core::ByteData::~ByteData((ByteData *)0x30d292);
  uStack_880 = uStack_880 & 0xffffffff00000000;
  local_848 = 2500000000;
  if ((local_9 & 1) != 0) {
    cfd::core::ConfidentialAssetId::GetData(&local_928,&exp_dummy_asset_ca);
    cfd::core::ByteData::GetBytes(&local_910,&local_928);
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30d302);
    memcpy((void *)((long)&uStack_840 + 1),puVar1,0x21);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
    cfd::core::ByteData::~ByteData((ByteData *)0x30d331);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
            (in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
  cfd::core::Txid::~Txid((Txid *)0x30d41a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_968,"0000000000000000000000000000000000000000000000000000000000000b01"
             ,&local_969);
  cfd::core::Txid::Txid(&local_948,&local_968);
  std::__cxx11::string::~string((string *)&local_968);
  std::allocator<char>::~allocator((allocator<char> *)&local_969);
  local_988 = 0;
  uStack_980 = 0;
  local_998 = 0;
  uStack_990 = 0;
  local_9a8 = 0;
  uStack_9a0 = 0;
  local_9b8 = 0;
  uStack_9b0 = 0;
  local_9c8 = 0;
  uStack_9c0 = 0;
  local_9d8 = 0;
  uStack_9d0 = 0;
  local_9e8 = 0;
  uStack_9e0 = 0;
  local_9f8 = 0;
  uStack_9f0 = 0;
  local_a08 = 0;
  uStack_a00 = 0;
  local_a18 = 0;
  uStack_a10 = 0;
  local_a28 = 0;
  uStack_a20 = 0;
  local_a38 = 0;
  uStack_a30 = 0;
  local_a48 = 0;
  uStack_a40 = 0;
  local_978 = 0;
  cfd::core::Txid::GetData(&local_a78,&local_948);
  cfd::core::ByteData::GetBytes(&local_a60,&local_a78);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30d548);
  uStack_a20 = *(undefined8 *)puVar1;
  local_a18 = *(undefined8 *)(puVar1 + 8);
  uStack_a10 = *(undefined8 *)(puVar1 + 0x10);
  local_a08 = *(undefined8 *)(puVar1 + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
  cfd::core::ByteData::~ByteData((ByteData *)0x30d58b);
  uStack_a00 = uStack_a00 & 0xffffffff00000000;
  local_9c8 = 0x19abe00;
  if ((local_9 & 1) != 0) {
    cfd::core::ConfidentialAssetId::GetData(&local_aa8,&exp_dummy_asset_cb);
    cfd::core::ByteData::GetBytes(&local_a90,&local_aa8);
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30d5fa);
    memcpy((void *)((long)&uStack_9c0 + 1),puVar1,0x21);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
    cfd::core::ByteData::~ByteData((ByteData *)0x30d629);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
            (in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
  cfd::core::Txid::~Txid((Txid *)0x30d712);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_ae8,"0000000000000000000000000000000000000000000000000000000000000b02"
             ,&local_ae9);
  cfd::core::Txid::Txid(&local_ac8,&local_ae8);
  std::__cxx11::string::~string((string *)&local_ae8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae9);
  local_b08 = 0;
  uStack_b00 = 0;
  local_b18 = 0;
  uStack_b10 = 0;
  local_b28 = 0;
  uStack_b20 = 0;
  local_b38 = 0;
  uStack_b30 = 0;
  local_b48 = 0;
  uStack_b40 = 0;
  local_b58 = 0;
  uStack_b50 = 0;
  local_b68 = 0;
  uStack_b60 = 0;
  local_b78 = 0;
  uStack_b70 = 0;
  local_b88 = 0;
  uStack_b80 = 0;
  local_b98 = 0;
  uStack_b90 = 0;
  local_ba8 = 0;
  uStack_ba0 = 0;
  local_bb8 = 0;
  uStack_bb0 = 0;
  local_bc8 = 0;
  uStack_bc0 = 0;
  local_af8 = 0;
  cfd::core::Txid::GetData(&local_bf8,&local_ac8);
  cfd::core::ByteData::GetBytes(&local_be0,&local_bf8);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30d840);
  uStack_ba0 = *(undefined8 *)puVar1;
  local_b98 = *(undefined8 *)(puVar1 + 8);
  uStack_b90 = *(undefined8 *)(puVar1 + 0x10);
  local_b88 = *(undefined8 *)(puVar1 + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
  cfd::core::ByteData::~ByteData((ByteData *)0x30d883);
  uStack_b80 = uStack_b80 & 0xffffffff00000000;
  local_b48 = 750000;
  if ((local_9 & 1) != 0) {
    cfd::core::ConfidentialAssetId::GetData(&local_c28,&exp_dummy_asset_cb);
    cfd::core::ByteData::GetBytes(&local_c10,&local_c28);
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30d8f2);
    memcpy((void *)((long)&uStack_b40 + 1),puVar1,0x21);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
    cfd::core::ByteData::~ByteData((ByteData *)0x30d921);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
            (in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
  cfd::core::Txid::~Txid((Txid *)0x30da0a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c68,"0000000000000000000000000000000000000000000000000000000000000b03"
             ,&local_c69);
  cfd::core::Txid::Txid(&local_c48,&local_c68);
  std::__cxx11::string::~string((string *)&local_c68);
  std::allocator<char>::~allocator((allocator<char> *)&local_c69);
  local_c88 = 0;
  uStack_c80 = 0;
  local_c98 = 0;
  uStack_c90 = 0;
  local_ca8 = 0;
  uStack_ca0 = 0;
  local_cb8 = 0;
  uStack_cb0 = 0;
  local_cc8 = 0;
  uStack_cc0 = 0;
  local_cd8 = 0;
  uStack_cd0 = 0;
  local_ce8 = 0;
  uStack_ce0 = 0;
  local_cf8 = 0;
  uStack_cf0 = 0;
  local_d08 = 0;
  uStack_d00 = 0;
  local_d18 = 0;
  uStack_d10 = 0;
  local_d28 = 0;
  uStack_d20 = 0;
  local_d38 = 0;
  uStack_d30 = 0;
  local_d48 = 0;
  uStack_d40 = 0;
  local_c78 = 0;
  cfd::core::Txid::GetData(&local_d78,&local_c48);
  cfd::core::ByteData::GetBytes(&local_d60,&local_d78);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30db38);
  uStack_d20 = *(undefined8 *)puVar1;
  local_d18 = *(undefined8 *)(puVar1 + 8);
  uStack_d10 = *(undefined8 *)(puVar1 + 0x10);
  local_d08 = *(undefined8 *)(puVar1 + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
  cfd::core::ByteData::~ByteData((ByteData *)0x30db7b);
  uStack_d00 = uStack_d00 & 0xffffffff00000000;
  local_cc8 = 0x14a61a62;
  if ((local_9 & 1) != 0) {
    cfd::core::ConfidentialAssetId::GetData(&local_da8,&exp_dummy_asset_cb);
    cfd::core::ByteData::GetBytes(&local_d90,&local_da8);
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30dbea);
    memcpy((void *)((long)&uStack_cc0 + 1),puVar1,0x21);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
    cfd::core::ByteData::~ByteData((ByteData *)0x30dc19);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
            (in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
  cfd::core::Txid::~Txid((Txid *)0x30dd02);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_de8,"0000000000000000000000000000000000000000000000000000000000000b04"
             ,&local_de9);
  cfd::core::Txid::Txid(&local_dc8,&local_de8);
  std::__cxx11::string::~string((string *)&local_de8);
  std::allocator<char>::~allocator((allocator<char> *)&local_de9);
  local_e08 = 0;
  uStack_e00 = 0;
  local_e18 = 0;
  uStack_e10 = 0;
  local_e28 = 0;
  uStack_e20 = 0;
  local_e38 = 0;
  uStack_e30 = 0;
  local_e48 = 0;
  uStack_e40 = 0;
  local_e58 = 0;
  uStack_e50 = 0;
  local_e68 = 0;
  uStack_e60 = 0;
  local_e78 = 0;
  uStack_e70 = 0;
  local_e88 = 0;
  uStack_e80 = 0;
  local_e98 = 0;
  uStack_e90 = 0;
  local_ea8 = 0;
  uStack_ea0 = 0;
  local_eb8 = 0;
  uStack_eb0 = 0;
  local_ec8 = 0;
  uStack_ec0 = 0;
  local_df8 = 0;
  cfd::core::Txid::GetData(&local_ef8,&local_dc8);
  cfd::core::ByteData::GetBytes(&local_ee0,&local_ef8);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30de2d);
  uStack_ea0 = *(undefined8 *)puVar1;
  local_e98 = *(undefined8 *)(puVar1 + 8);
  uStack_e90 = *(undefined8 *)(puVar1 + 0x10);
  local_e88 = *(undefined8 *)(puVar1 + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
  cfd::core::ByteData::~ByteData((ByteData *)0x30de70);
  uStack_e80 = uStack_e80 & 0xffffffff00000000;
  local_e48 = 0x119ed3e;
  if ((local_9 & 1) != 0) {
    cfd::core::ConfidentialAssetId::GetData(&local_f28,&exp_dummy_asset_cb);
    cfd::core::ByteData::GetBytes(&local_f10,&local_f28);
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30dedc);
    memcpy((void *)((long)&uStack_e40 + 1),puVar1,0x21);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
    cfd::core::ByteData::~ByteData((ByteData *)0x30df08);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
            (in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
  cfd::core::Txid::~Txid((Txid *)0x30dff1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f68,"0000000000000000000000000000000000000000000000000000000000000c01"
             ,&local_f69);
  cfd::core::Txid::Txid(&local_f48,&local_f68);
  std::__cxx11::string::~string((string *)&local_f68);
  std::allocator<char>::~allocator((allocator<char> *)&local_f69);
  local_f88 = 0;
  uStack_f80 = 0;
  local_f98 = 0;
  uStack_f90 = 0;
  local_fa8 = 0;
  uStack_fa0 = 0;
  local_fb8 = 0;
  uStack_fb0 = 0;
  local_fc8 = 0;
  uStack_fc0 = 0;
  local_fd8 = 0;
  uStack_fd0 = 0;
  local_fe8 = 0;
  uStack_fe0 = 0;
  local_ff8 = 0;
  uStack_ff0 = 0;
  local_1008 = 0;
  uStack_1000 = 0;
  local_1018 = 0;
  uStack_1010 = 0;
  local_1028 = 0;
  uStack_1020 = 0;
  local_1038 = 0;
  uStack_1030 = 0;
  local_1048 = 0;
  uStack_1040 = 0;
  local_f78 = 0;
  cfd::core::Txid::GetData(&local_1078,&local_f48);
  cfd::core::ByteData::GetBytes(&local_1060,&local_1078);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30e113);
  uStack_1020 = *(undefined8 *)puVar1;
  local_1018 = *(undefined8 *)(puVar1 + 8);
  uStack_1010 = *(undefined8 *)(puVar1 + 0x10);
  local_1008 = *(undefined8 *)(puVar1 + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
  cfd::core::ByteData::~ByteData((ByteData *)0x30e153);
  uStack_1000 = uStack_1000 & 0xffffffff00000000;
  local_fc8 = 0x23e8eb8;
  if ((local_9 & 1) != 0) {
    cfd::core::ConfidentialAssetId::GetData(&local_10a8,&exp_dummy_asset_cc);
    cfd::core::ByteData::GetBytes(&local_1090,&local_10a8);
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30e1bf);
    memcpy((void *)((long)&uStack_fc0 + 1),puVar1,0x21);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeba0);
    cfd::core::ByteData::~ByteData((ByteData *)0x30e1eb);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back
            (in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
  cfd::core::Txid::~Txid((Txid *)0x30e2d4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_10e8,
             "0000000000000000000000000000000000000000000000000000000000000c02",&local_10e9);
  cfd::core::Txid::Txid(&local_10c8,&local_10e8);
  std::__cxx11::string::~string((string *)&local_10e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10e9);
  __x = (value_type *)0x0;
  this = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x0;
  local_1108 = 0;
  uStack_1100 = 0;
  local_1118 = 0;
  uStack_1110 = 0;
  local_1128 = 0;
  uStack_1120 = 0;
  local_1138 = 0;
  uStack_1130 = 0;
  local_1148 = 0;
  uStack_1140 = 0;
  local_1158 = 0;
  uStack_1150 = 0;
  local_1168 = 0;
  uStack_1160 = 0;
  local_1178 = 0;
  uStack_1170 = 0;
  local_1188 = 0;
  uStack_1180 = 0;
  local_1198 = 0;
  uStack_1190 = 0;
  local_11a8 = 0;
  uStack_11a0 = 0;
  local_11b8 = 0;
  uStack_11b0 = 0;
  local_11c8 = 0;
  uStack_11c0 = 0;
  local_10f8 = 0;
  cfd::core::Txid::GetData(&local_11f8,&local_10c8);
  cfd::core::ByteData::GetBytes(&local_11e0,&local_11f8);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30e3f6);
  uStack_11a0 = *(undefined8 *)puVar1;
  local_1198 = *(undefined8 *)(puVar1 + 8);
  uStack_1190 = *(undefined8 *)(puVar1 + 0x10);
  local_1188 = *(undefined8 *)(puVar1 + 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  cfd::core::ByteData::~ByteData((ByteData *)0x30e436);
  uStack_1180 = uStack_1180 & 0xffffffff00000000;
  local_1148 = 0x79252f0;
  if ((local_9 & 1) != 0) {
    cfd::core::ConfidentialAssetId::GetData(&local_1228,&exp_dummy_asset_cc);
    cfd::core::ByteData::GetBytes(&local_1210,&local_1228);
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x30e4a2);
    memcpy((void *)((long)&uStack_1140 + 1),puVar1,0x21);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
    cfd::core::ByteData::~ByteData((ByteData *)0x30e4ce);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(this,__x);
  cfd::core::Txid::~Txid((Txid *)0x30e5ae);
  return in_RDI;
}

Assistant:

std::vector<Utxo> CfdGetElementsUtxoListByC(bool use_asset) {
  std::vector<Utxo> utxos;
  {
    Txid txid("7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 312500000;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_ca.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 78125000;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_ca.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 1250000000;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_ca.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 39062500;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_ca.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 156250000;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_ca.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 2500000000;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_ca.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("0000000000000000000000000000000000000000000000000000000000000b01");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 26918400;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_cb.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("0000000000000000000000000000000000000000000000000000000000000b02");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 750000;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_cb.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("0000000000000000000000000000000000000000000000000000000000000b03");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 346430050;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_cb.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("0000000000000000000000000000000000000000000000000000000000000b04");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 18476350;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_cb.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("0000000000000000000000000000000000000000000000000000000000000c01");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 37654200;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_cc.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
  {
    Txid txid("0000000000000000000000000000000000000000000000000000000000000c02");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 127030000;
#ifndef CFD_DISABLE_ELEMENTS
    if (use_asset)
      memcpy(utxo.asset, exp_dummy_asset_cc.GetData().GetBytes().data(), sizeof(utxo.asset));
#endif  // CFD_DISABLE_ELEMENTS
    utxos.push_back(utxo);
  }
/*
0:  A,  312500000
1:  A,   78125000
2:  A, 1250000000
3:  A,   39062500
4:  A,  156250000
5:  A, 2500000000
6:  B,   26918400
7:  B,     750000
8:  B,  346430050
9:  B,   18476350
10: C,   37654200
11: C,  127030000
*/
  return utxos;
}